

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xpath_string * __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::eval_string
          (xpath_string *__return_storage_ptr__,xpath_ast_node *this,xpath_context *c,
          xpath_stack *stack)

{
  byte *pbVar1;
  xpath_stack xVar2;
  xpath_ast_node *this_00;
  xpath_allocator *this_01;
  uint uVar3;
  undefined8 __s;
  char cVar4;
  bool bVar5;
  int iVar6;
  anon_union_8_5_7bd254c6_for__data aVar7;
  char_t *pcVar8;
  xml_node_struct *pxVar9;
  xpath_ast_node **ppxVar10;
  char_t *pcVar11;
  char *pcVar12;
  ulong uVar13;
  ulong uVar14;
  byte *pbVar15;
  size_t sVar16;
  char *pcVar17;
  byte *pbVar18;
  size_t sVar19;
  xml_attribute xVar20;
  char *pcVar21;
  long lVar22;
  uint uVar23;
  xpath_string *pxVar24;
  xpath_ast_node **ppxVar25;
  byte bVar26;
  long lVar27;
  byte *pbVar28;
  char *pcVar29;
  long lVar30;
  double dVar31;
  xml_node xVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  xpath_node xVar35;
  xpath_allocator_capture local_d8;
  xml_node local_b0;
  undefined1 local_a8 [16];
  xpath_node *local_98;
  xpath_string *local_88;
  double v;
  xml_attribute local_78;
  undefined1 local_68 [32];
  xpath_stack *local_48;
  xpath_stack local_40;
  
LAB_00125fe4:
  switch(this->_type) {
  case '\x12':
    goto switchD_00125ffc_caseD_12;
  default:
    cVar4 = this->_rettype;
    goto LAB_00126784;
  case '\x14':
    cVar4 = this->_rettype;
    if (cVar4 == '\x03') {
      if (((this->_data).variable)->_type == xpath_type_string) {
        pcVar21 = *(char **)((this->_data).variable + 1);
      }
      else {
        pcVar21 = (char *)0x0;
      }
      pcVar29 = "";
      if (pcVar21 != (char *)0x0) {
        pcVar29 = pcVar21;
      }
      __return_storage_ptr__->_buffer = pcVar29;
      goto LAB_0012687c;
    }
LAB_00126784:
    if (cVar4 != '\x01') {
      if (cVar4 != '\x02') {
        if (cVar4 != '\x04') {
LAB_00126872:
          aVar7.string = "";
          goto LAB_00126879;
        }
        bVar5 = eval_boolean(this,c,stack);
        pcVar21 = "false";
        if (bVar5) {
          pcVar21 = "true";
        }
        __return_storage_ptr__->_buffer = pcVar21;
        goto LAB_0012687c;
      }
      local_d8._target = (xpath_allocator *)eval_number(this,c,stack);
      this_01 = stack->result;
      if (((double)local_d8._target != 0.0) || (NAN((double)local_d8._target))) {
        if (NAN((double)local_d8._target)) {
          pcVar21 = "NaN";
        }
        else {
          if (((double)local_d8._target + (double)local_d8._target != (double)local_d8._target) ||
             (NAN((double)local_d8._target + (double)local_d8._target) ||
              NAN((double)local_d8._target))) {
            local_b0._root = (xml_node_struct *)local_d8._target;
            snprintf((char *)&local_d8,0x20,"%.*e",0xf);
            pbVar15 = (byte *)strchr((char *)&local_d8,0x65);
            iVar6 = atoi((char *)(pbVar15 + 1));
            pbVar28 = (byte *)((long)&local_d8._target + (ulong)((char)local_d8._target == '-') + 1)
            ;
            *pbVar28 = *(byte *)((long)&local_d8._target + (ulong)((char)local_d8._target == '-'));
            goto LAB_00126b6b;
          }
          pcVar21 = "-Infinity";
          if (0.0 < (double)local_d8._target) {
            pcVar21 = "Infinity";
          }
        }
      }
      else {
        pcVar21 = "0";
      }
      __return_storage_ptr__->_buffer = pcVar21;
      __return_storage_ptr__->_uses_heap = false;
      __return_storage_ptr__->_length_heap = 0;
      return __return_storage_ptr__;
    }
    local_d8._target = stack->temp;
    local_d8._state._root = (xpath_memory_block *)((xml_node_struct *)local_d8._target)->header;
    local_d8._state._root_size = (size_t)((xml_node_struct *)local_d8._target)->name;
    local_d8._state._error = (bool *)((xml_node_struct *)local_d8._target)->value;
    local_68._8_8_ = (xml_attribute_struct *)stack->result;
    local_68._0_8_ = local_d8._target;
    eval_node_set((xpath_node_set_raw *)local_a8,this,c,(xpath_stack *)local_68,nodeset_eval_first);
    if ((xpath_node *)CONCAT71(local_a8._9_7_,local_a8[8]) != local_98) {
      _v = xpath_node_set_raw::first((xpath_node_set_raw *)local_a8);
      string_value(__return_storage_ptr__,(xpath_node *)&v,stack->result);
      goto LAB_00126975;
    }
    break;
  case '\x19':
    local_d8._target = (xpath_allocator *)(c->n)._node._root;
    local_d8._state._root = (xpath_memory_block *)(c->n)._attribute._attr;
    aVar7.string = local_name((xpath_node *)&local_d8);
    goto LAB_00126879;
  case '\x1a':
    local_d8._target = stack->result;
    local_d8._state._root = (xpath_memory_block *)((xml_node_struct *)local_d8._target)->header;
    local_d8._state._root_size = (size_t)((xml_node_struct *)local_d8._target)->name;
    local_d8._state._error = (bool *)((xml_node_struct *)local_d8._target)->value;
    eval_node_set((xpath_node_set_raw *)local_a8,this->_left,c,stack,nodeset_eval_first);
    local_68._0_16_ = (undefined1  [16])xpath_node_set_raw::first((xpath_node_set_raw *)local_a8);
    pcVar21 = local_name((xpath_node *)local_68);
    goto LAB_00126968;
  case '\x1b':
    local_d8._target = (xpath_allocator *)(c->n)._node._root;
    local_d8._state._root = (xpath_memory_block *)(c->n)._attribute._attr;
    aVar7.string = namespace_uri((xpath_node *)&local_d8);
    goto LAB_00126879;
  case '\x1c':
    local_d8._target = stack->result;
    local_d8._state._root = (xpath_memory_block *)((xml_node_struct *)local_d8._target)->header;
    local_d8._state._root_size = (size_t)((xml_node_struct *)local_d8._target)->name;
    local_d8._state._error = (bool *)((xml_node_struct *)local_d8._target)->value;
    eval_node_set((xpath_node_set_raw *)local_a8,this->_left,c,stack,nodeset_eval_first);
    local_68._0_16_ = (undefined1  [16])xpath_node_set_raw::first((xpath_node_set_raw *)local_a8);
    pcVar21 = namespace_uri((xpath_node *)local_68);
    goto LAB_00126968;
  case '\x1d':
    pxVar9 = (xml_node_struct *)(c->n)._attribute._attr;
    if ((pxVar9 == (xml_node_struct *)0x0) &&
       (pxVar9 = (c->n)._node._root, pxVar9 == (xml_node_struct *)0x0)) goto LAB_00126872;
    aVar7.string = "";
    if (pxVar9->name != (char *)0x0) {
      aVar7.string = pxVar9->name;
    }
    goto LAB_00126879;
  case '\x1e':
    local_d8._target = stack->result;
    local_d8._state._root = (xpath_memory_block *)((xml_node_struct *)local_d8._target)->header;
    local_d8._state._root_size = (size_t)((xml_node_struct *)local_d8._target)->name;
    local_d8._state._error = (bool *)((xml_node_struct *)local_d8._target)->value;
    eval_node_set((xpath_node_set_raw *)local_a8,this->_left,c,stack,nodeset_eval_first);
    xVar35 = xpath_node_set_raw::first((xpath_node_set_raw *)local_a8);
    xVar20._attr = xVar35._attribute._attr._attr;
    if ((xVar35._attribute._attr._attr != (xml_attribute_struct *)0x0) ||
       (xVar20._attr = (xml_attribute_struct *)xVar35._node._root._root,
       xVar35._node._root._root != (xml_node_struct *)0x0)) {
      pcVar21 = "";
      if (((xml_node_struct *)xVar20._attr)->name != (char *)0x0) {
        pcVar21 = ((xml_node_struct *)xVar20._attr)->name;
      }
      goto LAB_00126968;
    }
    break;
  case '\x1f':
    string_value(__return_storage_ptr__,&c->n,stack->result);
    return __return_storage_ptr__;
  case ' ':
    goto switchD_00125ffc_caseD_20;
  case '!':
    local_d8._target = stack->temp;
    local_d8._state._root = (xpath_memory_block *)((xml_node_struct *)local_d8._target)->header;
    local_d8._state._root_size = (size_t)((xml_node_struct *)local_d8._target)->name;
    local_d8._state._error = (bool *)((xml_node_struct *)local_d8._target)->value;
    lVar22 = 1;
    sVar19 = 0x18;
    ppxVar25 = &this->_right;
    for (ppxVar10 = ppxVar25; *ppxVar10 != (xpath_ast_node *)0x0; ppxVar10 = &(*ppxVar10)->_next) {
      lVar22 = lVar22 + 1;
      sVar19 = sVar19 + 0x18;
    }
    local_b0._root = (xml_node_struct *)__return_storage_ptr__;
    local_88 = (xpath_string *)xpath_allocator::allocate(local_d8._target,sVar19);
    if (local_88 == (xpath_string *)0x0) {
      pcVar21 = "";
      __return_storage_ptr__ = (xpath_string *)local_b0;
LAB_00126968:
      ((xml_node_struct *)__return_storage_ptr__)->header = (uintptr_t)pcVar21;
LAB_0012696b:
      *(bool *)&((xml_node_struct *)__return_storage_ptr__)->name = false;
      ((xml_node_struct *)__return_storage_ptr__)->value = (char_t *)0x0;
      goto LAB_00126975;
    }
    xVar2 = *stack;
    local_68._0_8_ = xVar2.temp;
    local_68._8_4_ = (int)xVar2.result;
    local_68._12_4_ = xVar2.result._4_4_;
    local_48 = stack;
    eval_string((xpath_string *)local_a8,this->_left,c,(xpath_stack *)local_68);
    local_88->_length_heap = (size_t)local_98;
    local_88->_buffer = (char_t *)local_a8._0_8_;
    *(ulong *)&local_88->_uses_heap = CONCAT71(local_a8._9_7_,local_a8[8]);
    pxVar24 = local_88;
    while( true ) {
      this_00 = *ppxVar25;
      if (this_00 == (xpath_ast_node *)0x0) break;
      eval_string((xpath_string *)local_a8,this_00,c,(xpath_stack *)local_68);
      pxVar24[1]._length_heap = (size_t)local_98;
      pxVar24[1]._buffer = (char_t *)local_a8._0_8_;
      *(ulong *)&pxVar24[1]._uses_heap = CONCAT71(local_a8._9_7_,local_a8[8]);
      ppxVar25 = &this_00->_next;
      pxVar24 = pxVar24 + 1;
    }
    lVar30 = 0;
    pxVar24 = local_88;
    lVar27 = lVar22;
    while (bVar5 = lVar27 != 0, lVar27 = lVar27 + -1, bVar5) {
      sVar19 = xpath_string::length(pxVar24);
      lVar30 = lVar30 + sVar19;
      pxVar24 = pxVar24 + 1;
    }
    pcVar21 = (char *)xpath_allocator::allocate(local_48->result,lVar30 + 1);
    if (pcVar21 == (char *)0x0) {
      pcVar21 = "";
      bVar5 = false;
      pcVar29 = (char *)0x0;
    }
    else {
      pcVar29 = pcVar21;
      for (lVar27 = 0; lVar22 != lVar27; lVar27 = lVar27 + 1) {
        for (pcVar17 = local_88[lVar27]._buffer; *pcVar17 != '\0'; pcVar17 = pcVar17 + 1) {
          *pcVar29 = *pcVar17;
          pcVar29 = pcVar29 + 1;
        }
      }
      *pcVar29 = '\0';
      pcVar29 = pcVar29 + -(long)pcVar21;
      bVar5 = true;
    }
    (local_b0._root)->header = (uintptr_t)pcVar21;
    *(bool *)&(local_b0._root)->name = bVar5;
    (local_b0._root)->value = pcVar29;
    __return_storage_ptr__ = (xpath_string *)local_b0;
    goto LAB_00126975;
  case '$':
    local_d8._target = stack->temp;
    local_d8._state._root = (xpath_memory_block *)((xml_node_struct *)local_d8._target)->header;
    local_d8._state._root_size = (size_t)((xml_node_struct *)local_d8._target)->name;
    local_d8._state._error = (bool *)((xml_node_struct *)local_d8._target)->value;
    local_78._attr = (xml_attribute_struct *)stack->result;
    v = (double)local_d8._target;
    eval_string((xpath_string *)local_a8,this->_left,c,(xpath_stack *)&v);
    eval_string((xpath_string *)local_68,this->_right,c,(xpath_stack *)&v);
    pcVar21 = strstr((char *)local_a8._0_8_,(char *)local_68._0_8_);
    if (pcVar21 != (char *)0x0) {
      xpath_string::from_heap(__return_storage_ptr__,(char_t *)local_a8._0_8_,pcVar21,stack->result)
      ;
      goto LAB_00126975;
    }
    break;
  case '%':
    local_d8._target = stack->temp;
    local_d8._state._root = (xpath_memory_block *)((xml_node_struct *)local_d8._target)->header;
    local_d8._state._root_size = (size_t)((xml_node_struct *)local_d8._target)->name;
    local_d8._state._error = (bool *)((xml_node_struct *)local_d8._target)->value;
    local_78._attr = (xml_attribute_struct *)stack->result;
    v = (double)local_d8._target;
    eval_string((xpath_string *)local_a8,this->_left,c,(xpath_stack *)&v);
    eval_string((xpath_string *)local_68,this->_right,c,(xpath_stack *)&v);
    pcVar21 = strstr((char *)local_a8._0_8_,(char *)local_68._0_8_);
    if (pcVar21 == (char *)0x0) {
      pcVar21 = "";
    }
    else {
      sVar19 = xpath_string::length((xpath_string *)local_68);
      pcVar21 = pcVar21 + sVar19;
      if (local_a8[8] == true) {
        sVar19 = xpath_string::length((xpath_string *)local_a8);
        xpath_string::from_heap
                  (__return_storage_ptr__,pcVar21,(char_t *)(local_a8._0_8_ + sVar19),stack->result)
        ;
        goto LAB_00126975;
      }
    }
    __return_storage_ptr__->_buffer = pcVar21;
    goto LAB_0012696b;
  case '&':
    local_d8._target = stack->temp;
    local_d8._state._root = (xpath_memory_block *)((xml_node_struct *)local_d8._target)->header;
    local_d8._state._root_size = (size_t)((xml_node_struct *)local_d8._target)->name;
    local_d8._state._error = (bool *)((xml_node_struct *)local_d8._target)->value;
    local_68._8_8_ = (xml_attribute_struct *)stack->result;
    local_68._0_8_ = local_d8._target;
    eval_string((xpath_string *)local_a8,this->_left,c,(xpath_stack *)local_68);
    sVar19 = xpath_string::length((xpath_string *)local_a8);
    dVar31 = eval_number(this->_right,c,stack);
    v = floor(dVar31 + 0.5);
    pcVar21 = "";
    lVar22 = sVar19 + 1;
    auVar33._8_4_ = (int)((ulong)lVar22 >> 0x20);
    auVar33._0_8_ = lVar22;
    auVar33._12_4_ = 0x45300000;
    if (v < (auVar33._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar22) - 4503599627370496.0)) {
      xVar32._root = (xml_node_struct *)0x3ff0000000000000;
      if (1.0 <= v) {
        xVar32._root = (xml_node_struct *)v;
      }
      pcVar21 = (char *)(local_a8._0_8_ +
                        (((long)((double)xVar32._root - 9.223372036854776e+18) &
                          (long)(double)xVar32._root >> 0x3f | (long)(double)xVar32._root) - 1));
      if (local_a8[8] == true) {
        sVar19 = xpath_string::length((xpath_string *)local_a8);
        xpath_string::from_heap
                  (__return_storage_ptr__,pcVar21,(char_t *)(local_a8._0_8_ + sVar19),stack->result)
        ;
        goto LAB_00126975;
      }
    }
    __return_storage_ptr__->_buffer = pcVar21;
    goto LAB_0012696b;
  case '\'':
    local_d8._target = stack->temp;
    local_d8._state._root = (xpath_memory_block *)((xml_node_struct *)local_d8._target)->header;
    local_d8._state._root_size = (size_t)((xml_node_struct *)local_d8._target)->name;
    local_d8._state._error = (bool *)((xml_node_struct *)local_d8._target)->value;
    local_68._8_8_ = (xml_attribute_struct *)stack->result;
    local_68._0_8_ = local_d8._target;
    eval_string((xpath_string *)local_a8,this->_left,c,(xpath_stack *)local_68);
    sVar19 = xpath_string::length((xpath_string *)local_a8);
    dVar31 = eval_number(this->_right,c,stack);
    local_b0._root = (xml_node_struct *)floor(dVar31 + 0.5);
    dVar31 = eval_number(this->_right->_next,c,stack);
    dVar31 = floor(dVar31 + 0.5);
    v = (double)local_b0._root;
    pcVar21 = "";
    if (!NAN((double)local_b0._root) && !NAN((double)local_b0._root)) {
      v = dVar31 + (double)local_b0._root;
      if (!NAN(v) && !NAN(v)) {
        uVar13 = sVar19 + 1;
        auVar34._8_4_ = (int)(uVar13 >> 0x20);
        auVar34._0_8_ = uVar13;
        auVar34._12_4_ = 0x45300000;
        dVar31 = (auVar34._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar13) - 4503599627370496.0);
        if ((((double)local_b0._root < dVar31) && ((double)local_b0._root < v)) && (1.0 <= v)) {
          xVar32._root = (xml_node_struct *)0x3ff0000000000000;
          if (1.0 <= (double)local_b0._root) {
            xVar32._root = local_b0._root;
          }
          uVar14 = (long)v >> 0x3f & (long)(v - 9.223372036854776e+18) | (long)v;
          if (dVar31 <= v) {
            uVar14 = uVar13;
          }
          pcVar21 = (char *)(local_a8._0_8_ +
                            (((long)((double)xVar32._root - 9.223372036854776e+18) &
                              (long)(double)xVar32._root >> 0x3f | (long)(double)xVar32._root) - 1))
          ;
          if ((uVar14 != uVar13) || (local_a8[8] == true)) {
            xpath_string::from_heap
                      (__return_storage_ptr__,pcVar21,(char_t *)(local_a8._0_8_ + (uVar14 - 1)),
                       stack->result);
            goto LAB_00126975;
          }
        }
      }
    }
    __return_storage_ptr__->_buffer = pcVar21;
    goto LAB_0012696b;
  case '*':
    string_value((xpath_string *)&local_d8,&c->n,stack->result);
    goto LAB_001263b5;
  case '+':
    eval_string((xpath_string *)&local_d8,this->_left,c,stack);
LAB_001263b5:
    pcVar11 = xpath_string::data((xpath_string *)&local_d8,stack->result);
    bVar5 = pcVar11 == (char_t *)0x0;
    if (bVar5) {
      pcVar11 = "";
      sVar19 = 0;
    }
    else {
      pcVar8 = normalize_space(pcVar11);
      sVar19 = (long)pcVar8 - (long)pcVar11;
    }
    __return_storage_ptr__->_buffer = pcVar11;
    __return_storage_ptr__->_uses_heap = !bVar5;
    __return_storage_ptr__->_length_heap = sVar19;
    return __return_storage_ptr__;
  case ',':
    local_d8._target = stack->temp;
    local_d8._state._root = (xpath_memory_block *)((xml_node_struct *)local_d8._target)->header;
    local_d8._state._root_size = (size_t)((xml_node_struct *)local_d8._target)->name;
    local_d8._state._error = (bool *)((xml_node_struct *)local_d8._target)->value;
    local_40.temp = stack->result;
    local_40.result = local_d8._target;
    eval_string((xpath_string *)local_a8,this->_left,c,stack);
    eval_string((xpath_string *)local_68,this->_right,c,&local_40);
    eval_string((xpath_string *)&v,this->_right->_next,c,&local_40);
    pcVar11 = xpath_string::data((xpath_string *)local_a8,stack->result);
    if (pcVar11 == (char_t *)0x0) {
      pcVar11 = "";
      bVar5 = false;
      pcVar29 = (char *)0x0;
      goto LAB_001269aa;
    }
    __s = local_68._0_8_;
    local_88 = (xpath_string *)v;
    local_b0._root = (xml_node_struct *)__return_storage_ptr__;
    sVar19 = xpath_string::length((xpath_string *)&v);
    pcVar21 = pcVar11;
    pcVar29 = pcVar11;
    goto LAB_00126744;
  case ':':
    eval_string((xpath_string *)&local_d8,this->_left,c,stack);
    pbVar15 = (byte *)xpath_string::data((xpath_string *)&local_d8,stack->result);
    if (pbVar15 != (byte *)0x0) {
      pcVar11 = (this->_data).string;
      pbVar18 = pbVar15;
      pbVar28 = pbVar15;
      while( true ) {
        bVar26 = *pbVar28;
        if ((ulong)bVar26 == 0) break;
        uVar13 = 1;
        if (-1 < (char)bVar26) {
          bVar26 = pcVar11[bVar26];
          uVar13 = (ulong)(-1 < (char)bVar26);
        }
        pbVar28 = pbVar28 + 1;
        *pbVar18 = bVar26;
        pbVar18 = pbVar18 + uVar13;
      }
      goto LAB_00126c3e;
    }
    pbVar15 = (byte *)0x12f24c;
    bVar5 = false;
    sVar19 = 0;
    goto LAB_00126c46;
  }
  pcVar21 = "";
  goto LAB_00126968;
code_r0x00126762:
  uVar13 = (long)pcVar12 - __s;
  if (uVar13 < sVar19) {
    cVar4 = *(char *)((long)local_88 + uVar13);
LAB_00126776:
    *pcVar29 = cVar4;
    pcVar29 = pcVar29 + 1;
  }
  goto LAB_00126744;
switchD_00125ffc_caseD_20:
  this = this->_left;
  goto LAB_00125fe4;
switchD_00125ffc_caseD_12:
  aVar7 = this->_data;
LAB_00126879:
  __return_storage_ptr__->_buffer = (char_t *)aVar7;
LAB_0012687c:
  __return_storage_ptr__->_uses_heap = false;
  __return_storage_ptr__->_length_heap = 0;
  return __return_storage_ptr__;
  while (pbVar1 = pbVar15 + -1, pbVar18 = pbVar15, pbVar15 = pbVar15 + -1, *pbVar1 == 0x30) {
LAB_00126b6b:
    pbVar18 = pbVar28;
    if (pbVar15 == pbVar28) break;
  }
  uVar23 = iVar6 + 1;
  *pbVar18 = 0;
  sVar16 = strlen((char *)&local_d8);
  uVar3 = -uVar23;
  if (0 < (int)uVar23) {
    uVar3 = uVar23;
  }
  pbVar15 = (byte *)xpath_allocator::allocate(this_01,uVar3 + sVar16 + 4);
  if (pbVar15 == (byte *)0x0) {
    pbVar15 = (byte *)0x12f24c;
    bVar5 = false;
    sVar19 = 0;
  }
  else {
    pbVar18 = pbVar15;
    if ((double)local_b0._root < 0.0) {
      pbVar18 = pbVar15 + 1;
      *pbVar15 = 0x2d;
    }
    if (iVar6 < 0) {
      *pbVar18 = 0x30;
      pbVar18 = pbVar18 + 1;
    }
    else {
      for (; 0 < (int)uVar23; uVar23 = uVar23 - 1) {
        bVar26 = *pbVar28;
        bVar5 = bVar26 != 0;
        if (!bVar5) {
          bVar26 = 0x30;
        }
        pbVar28 = pbVar28 + bVar5;
        *pbVar18 = bVar26;
        pbVar18 = pbVar18 + 1;
      }
      uVar23 = 0;
    }
    if (*pbVar28 != 0) {
      *pbVar18 = 0x2e;
      for (; (int)uVar23 < 0; uVar23 = uVar23 + 1) {
        pbVar18 = pbVar18 + 1;
        *pbVar18 = 0x30;
      }
      for (lVar22 = 1; pbVar28[lVar22 + -1] != 0; lVar22 = lVar22 + 1) {
        pbVar18[lVar22] = pbVar28[lVar22 + -1];
      }
      pbVar18 = pbVar18 + lVar22;
    }
LAB_00126c3e:
    *pbVar18 = 0;
    sVar19 = (long)pbVar18 - (long)pbVar15;
    bVar5 = true;
  }
LAB_00126c46:
  __return_storage_ptr__->_buffer = (char_t *)pbVar15;
  __return_storage_ptr__->_uses_heap = bVar5;
  __return_storage_ptr__->_length_heap = sVar19;
  return __return_storage_ptr__;
LAB_00126744:
  pcVar17 = pcVar21 + 1;
  cVar4 = *pcVar21;
  if (cVar4 != 0) {
    pcVar12 = strchr((char *)__s,(int)cVar4);
    pcVar21 = pcVar17;
    if (pcVar12 != (char *)0x0) goto code_r0x00126762;
    goto LAB_00126776;
  }
  *pcVar29 = '\0';
  pcVar29 = pcVar29 + -(long)pcVar11;
  bVar5 = true;
  __return_storage_ptr__ = (xpath_string *)local_b0;
LAB_001269aa:
  ((xml_node_struct *)__return_storage_ptr__)->header = (uintptr_t)pcVar11;
  *(bool *)&((xml_node_struct *)__return_storage_ptr__)->name = bVar5;
  ((xml_node_struct *)__return_storage_ptr__)->value = pcVar29;
LAB_00126975:
  xpath_allocator_capture::~xpath_allocator_capture(&local_d8);
  return (xpath_string *)(xml_node_struct *)__return_storage_ptr__;
}

Assistant:

xpath_string eval_string(const xpath_context& c, const xpath_stack& stack)
		{
			switch (_type)
			{
			case ast_string_constant:
				return xpath_string::from_const(_data.string);

			case ast_func_local_name_0:
			{
				xpath_node na = c.n;

				return xpath_string::from_const(local_name(na));
			}

			case ast_func_local_name_1:
			{
				xpath_allocator_capture cr(stack.result);

				xpath_node_set_raw ns = _left->eval_node_set(c, stack, nodeset_eval_first);
				xpath_node na = ns.first();

				return xpath_string::from_const(local_name(na));
			}

			case ast_func_name_0:
			{
				xpath_node na = c.n;

				return xpath_string::from_const(qualified_name(na));
			}

			case ast_func_name_1:
			{
				xpath_allocator_capture cr(stack.result);

				xpath_node_set_raw ns = _left->eval_node_set(c, stack, nodeset_eval_first);
				xpath_node na = ns.first();

				return xpath_string::from_const(qualified_name(na));
			}

			case ast_func_namespace_uri_0:
			{
				xpath_node na = c.n;

				return xpath_string::from_const(namespace_uri(na));
			}

			case ast_func_namespace_uri_1:
			{
				xpath_allocator_capture cr(stack.result);

				xpath_node_set_raw ns = _left->eval_node_set(c, stack, nodeset_eval_first);
				xpath_node na = ns.first();

				return xpath_string::from_const(namespace_uri(na));
			}

			case ast_func_string_0:
				return string_value(c.n, stack.result);

			case ast_func_string_1:
				return _left->eval_string(c, stack);

			case ast_func_concat:
				return eval_string_concat(c, stack);

			case ast_func_substring_before:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_string s = _left->eval_string(c, swapped_stack);
				xpath_string p = _right->eval_string(c, swapped_stack);

				const char_t* pos = find_substring(s.c_str(), p.c_str());

				return pos ? xpath_string::from_heap(s.c_str(), pos, stack.result) : xpath_string();
			}

			case ast_func_substring_after:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_string s = _left->eval_string(c, swapped_stack);
				xpath_string p = _right->eval_string(c, swapped_stack);

				const char_t* pos = find_substring(s.c_str(), p.c_str());
				if (!pos) return xpath_string();

				const char_t* rbegin = pos + p.length();
				const char_t* rend = s.c_str() + s.length();

				return s.uses_heap() ? xpath_string::from_heap(rbegin, rend, stack.result) : xpath_string::from_const(rbegin);
			}

			case ast_func_substring_2:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_string s = _left->eval_string(c, swapped_stack);
				size_t s_length = s.length();

				double first = round_nearest(_right->eval_number(c, stack));

				if (is_nan(first)) return xpath_string(); // NaN
				else if (first >= static_cast<double>(s_length + 1)) return xpath_string();

				size_t pos = first < 1 ? 1 : static_cast<size_t>(first);
				assert(1 <= pos && pos <= s_length + 1);

				const char_t* rbegin = s.c_str() + (pos - 1);
				const char_t* rend = s.c_str() + s.length();

				return s.uses_heap() ? xpath_string::from_heap(rbegin, rend, stack.result) : xpath_string::from_const(rbegin);
			}

			case ast_func_substring_3:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_string s = _left->eval_string(c, swapped_stack);
				size_t s_length = s.length();

				double first = round_nearest(_right->eval_number(c, stack));
				double last = first + round_nearest(_right->_next->eval_number(c, stack));

				if (is_nan(first) || is_nan(last)) return xpath_string();
				else if (first >= static_cast<double>(s_length + 1)) return xpath_string();
				else if (first >= last) return xpath_string();
				else if (last < 1) return xpath_string();

				size_t pos = first < 1 ? 1 : static_cast<size_t>(first);
				size_t end = last >= static_cast<double>(s_length + 1) ? s_length + 1 : static_cast<size_t>(last);

				assert(1 <= pos && pos <= end && end <= s_length + 1);
				const char_t* rbegin = s.c_str() + (pos - 1);
				const char_t* rend = s.c_str() + (end - 1);

				return (end == s_length + 1 && !s.uses_heap()) ? xpath_string::from_const(rbegin) : xpath_string::from_heap(rbegin, rend, stack.result);
			}

			case ast_func_normalize_space_0:
			{
				xpath_string s = string_value(c.n, stack.result);

				char_t* begin = s.data(stack.result);
				if (!begin) return xpath_string();

				char_t* end = normalize_space(begin);

				return xpath_string::from_heap_preallocated(begin, end);
			}

			case ast_func_normalize_space_1:
			{
				xpath_string s = _left->eval_string(c, stack);

				char_t* begin = s.data(stack.result);
				if (!begin) return xpath_string();

				char_t* end = normalize_space(begin);

				return xpath_string::from_heap_preallocated(begin, end);
			}

			case ast_func_translate:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_string s = _left->eval_string(c, stack);
				xpath_string from = _right->eval_string(c, swapped_stack);
				xpath_string to = _right->_next->eval_string(c, swapped_stack);

				char_t* begin = s.data(stack.result);
				if (!begin) return xpath_string();

				char_t* end = translate(begin, from.c_str(), to.c_str(), to.length());

				return xpath_string::from_heap_preallocated(begin, end);
			}

			case ast_opt_translate_table:
			{
				xpath_string s = _left->eval_string(c, stack);

				char_t* begin = s.data(stack.result);
				if (!begin) return xpath_string();

				char_t* end = translate_table(begin, _data.table);

				return xpath_string::from_heap_preallocated(begin, end);
			}

			case ast_variable:
			{
				assert(_rettype == _data.variable->type());

				if (_rettype == xpath_type_string)
					return xpath_string::from_const(_data.variable->get_string());

				// variable needs to be converted to the correct type, this is handled by the fallthrough block below
				break;
			}

			default:
				;
			}

			// none of the ast types that return the value directly matched, we need to perform type conversion
			switch (_rettype)
			{
			case xpath_type_boolean:
				return xpath_string::from_const(eval_boolean(c, stack) ? PUGIXML_TEXT("true") : PUGIXML_TEXT("false"));

			case xpath_type_number:
				return convert_number_to_string(eval_number(c, stack), stack.result);

			case xpath_type_node_set:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_node_set_raw ns = eval_node_set(c, swapped_stack, nodeset_eval_first);
				return ns.empty() ? xpath_string() : string_value(ns.first(), stack.result);
			}

			default:
				assert(false && "Wrong expression for return type string"); // unreachable
				return xpath_string();
			}
		}